

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,WriteStream *w)

{
  bool bVar1;
  CodePrinter *this_00;
  OutputDeclaration *pOVar2;
  string *s;
  Expression *pEVar3;
  WriteStream *w_local;
  PrinterStream *this_local;
  
  this_00 = choc::text::CodePrinter::operator<<(this->out,"write ");
  pOVar2 = pool_ref<soul::heart::OutputDeclaration>::operator->(&w->target);
  s = Identifier::toString_abi_cxx11_(&(pOVar2->super_IODeclaration).name);
  choc::text::CodePrinter::operator<<(this_00,s);
  bVar1 = pool_ptr<soul::heart::Expression>::operator!=(&w->element,(void *)0x0);
  if (bVar1) {
    choc::text::CodePrinter::operator<<(this->out,'[');
    pEVar3 = pool_ptr<soul::heart::Expression>::operator*(&w->element);
    printExpression(this,pEVar3);
    choc::text::CodePrinter::operator<<(this->out,']');
  }
  choc::text::CodePrinter::operator<<(this->out,' ');
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&w->value);
  printExpression(this,pEVar3);
  return;
}

Assistant:

void printDescription (const heart::WriteStream& w)
        {
            out << "write " << w.target->name.toString();

            if (w.element != nullptr)
            {
                out << '[';
                printExpression (*w.element);
                out << ']';
            }

            out << ' ';
            printExpression (w.value);
        }